

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test10::test(GPUShaderFP64Test10 *this,functionEnum function,typeDetails *type)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  functionObject *__p;
  element_type *peVar6;
  uint local_70;
  GLuint vertex;
  auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject> local_60;
  auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject> function_object;
  programInfo program;
  Functions *gl;
  typeDetails *type_local;
  functionEnum function_local;
  GPUShaderFP64Test10 *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  bVar1 = isFunctionImplemented(this,function,type);
  if (bVar1) {
    Utils::programInfo::programInfo
              ((programInfo *)&function_object,(this->super_TestCase).m_context);
    __p = getFunctionObject(this,function,type);
    std::auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject>::auto_ptr(&local_60,__p);
    peVar6 = std::auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject>::operator*(&local_60);
    prepareProgram(this,peVar6,(programInfo *)&function_object);
    peVar6 = std::auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject>::operator*(&local_60);
    prepareTestData(this,peVar6);
    (**(code **)(lVar5 + 0x1680))(program.m_fragment_shader_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"UseProgram",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x3b0d);
    for (local_70 = 0; local_70 < 0x400; local_70 = local_70 + 1) {
      peVar6 = std::auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject>::operator*(&local_60);
      testBegin(this,peVar6,program.m_fragment_shader_id,local_70);
      (**(code **)(lVar5 + 0x30))(0);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"BeginTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b14);
      (**(code **)(lVar5 + 0x538))(0,0,1);
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"DrawArrays",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b17);
      (**(code **)(lVar5 + 0x638))();
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"EndTransformFeedback",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x3b1a);
      peVar6 = std::auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject>::operator*(&local_60);
      bVar1 = verifyResults(this,peVar6,local_70);
      if (!bVar1) {
        this_local._7_1_ = false;
        goto LAB_00fae3f2;
      }
    }
    this_local._7_1_ = true;
LAB_00fae3f2:
    std::auto_ptr<gl4cts::GPUShaderFP64Test10::functionObject>::~auto_ptr(&local_60);
    Utils::programInfo::~programInfo((programInfo *)&function_object);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool GPUShaderFP64Test10::test(functionEnum function, const typeDetails& type)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Skip if function is not implemented for type */
	if (false == isFunctionImplemented(function, type))
	{
		return true;
	}

	Utils::programInfo			  program(m_context);
	std::auto_ptr<functionObject> function_object(getFunctionObject(function, type));

	prepareProgram(*function_object, program);
	prepareTestData(*function_object);

	/* Set up program */
	gl.useProgram(program.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	for (glw::GLuint vertex = 0; vertex < m_n_veritces; ++vertex)
	{
		testBegin(*function_object, program.m_program_object_id, vertex);

		gl.beginTransformFeedback(GL_POINTS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BeginTransformFeedback");

		gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "EndTransformFeedback");

		if (false == verifyResults(*function_object, vertex))
		{
			return false;
		}
	}

	return true;
}